

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Fixed mm_axis_unmap(PS_DesignMap axismap,FT_Fixed ncv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  FT_Long FVar4;
  int local_24;
  int j;
  FT_Fixed ncv_local;
  PS_DesignMap axismap_local;
  
  if (*axismap->blend_points < ncv) {
    for (local_24 = 1; local_24 < (int)(uint)axismap->num_points; local_24 = local_24 + 1) {
      if (ncv <= axismap->blend_points[local_24]) {
        lVar1 = axismap->design_points[local_24 + -1];
        lVar2 = axismap->design_points[local_24];
        lVar3 = axismap->design_points[local_24 + -1];
        FVar4 = FT_DivFix(ncv - axismap->blend_points[local_24 + -1],
                          axismap->blend_points[local_24] - axismap->blend_points[local_24 + -1]);
        return lVar1 * 0x10000 + (lVar2 - lVar3) * FVar4;
      }
    }
    lVar1 = axismap->design_points[(int)(axismap->num_points - 1)];
  }
  else {
    lVar1 = *axismap->design_points;
  }
  axismap_local = (PS_DesignMap)(lVar1 << 0x10);
  return (FT_Fixed)axismap_local;
}

Assistant:

static FT_Fixed
  mm_axis_unmap( PS_DesignMap  axismap,
                 FT_Fixed      ncv )
  {
    int  j;


    if ( ncv <= axismap->blend_points[0] )
      return INT_TO_FIXED( axismap->design_points[0] );

    for ( j = 1; j < axismap->num_points; j++ )
    {
      if ( ncv <= axismap->blend_points[j] )
        return INT_TO_FIXED( axismap->design_points[j - 1] ) +
               ( axismap->design_points[j] - axismap->design_points[j - 1] ) *
               FT_DivFix( ncv - axismap->blend_points[j - 1],
                          axismap->blend_points[j] -
                            axismap->blend_points[j - 1] );
    }

    return INT_TO_FIXED( axismap->design_points[axismap->num_points - 1] );
  }